

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_initialize_host(char *tag)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  undefined8 in_RDI;
  loader_manager_impl manager_impl;
  plugin p;
  loader_impl in_stack_00000048;
  plugin in_stack_00000050;
  plugin_manager in_stack_00000058;
  int local_4;
  
  lVar2 = plugin_manager_get(&loader_manager,in_RDI);
  if (lVar2 == 0) {
    local_4 = 1;
  }
  else {
    plugin_impl(lVar2);
    iVar1 = loader_impl_initialize(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (iVar1 == 0) {
      plVar3 = (long *)plugin_manager_impl(&loader_manager);
      *plVar3 = lVar2;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int loader_initialize_host(const loader_tag tag)
{
	plugin p = plugin_manager_get(&loader_manager, tag);

	if (p == NULL)
	{
		return 1;
	}

	if (loader_impl_initialize(&loader_manager, p, plugin_impl_type(p, loader_impl)) != 0)
	{
		return 1;
	}
	else
	{
		loader_manager_impl manager_impl = plugin_manager_impl_type(&loader_manager, loader_manager_impl);

		manager_impl->host = p;

		return 0;
	}
}